

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_mkstemp(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop;
  undefined8 uVar3;
  uv_buf_t uVar4;
  undefined1 local_1e0 [8];
  uv_fs_t req;
  char path_template [17];
  int fd;
  int r;
  
  req.bufsml[3].len._0_1_ = 't';
  req.bufsml[3].len._1_1_ = 'e';
  req.bufsml[3].len._2_1_ = 's';
  req.bufsml[3].len._3_1_ = 't';
  req.bufsml[3].len._4_1_ = '_';
  req.bufsml[3].len._5_1_ = 'f';
  req.bufsml[3].len._6_1_ = 'i';
  req.bufsml[3].len._7_1_ = 'l';
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_mkstemp(::loop,&mkstemp_req1,&req.bufsml[3].len,mkstemp_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4e9,"r == 0");
    abort();
  }
  uv_run(::loop,0);
  if (mkstemp_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4ec,"mkstemp_cb_count == 1");
    abort();
  }
  iVar1 = uv_fs_mkstemp(0,&mkstemp_req2,&req.bufsml[3].len);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4f0,"r >= 0");
    abort();
  }
  check_mkstemp_result(&mkstemp_req2);
  iVar1 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4f4,"strcmp(mkstemp_req1.path, mkstemp_req2.path) != 0");
    abort();
  }
  iVar1 = uv_fs_mkstemp(0,&mkstemp_req3,"test_file");
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4f7,"uv_fs_mkstemp(NULL, &mkstemp_req3, \"test_file\", NULL) == UV_EINVAL");
    abort();
  }
  iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
  iVar1 = uv_fs_write(0,local_1e0,mkstemp_req1.result & 0xffffffff,&iov,1,0xffffffffffffffff,0);
  if (iVar1 != 0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4fc,"r == sizeof(test_buf)");
    abort();
  }
  if (req.cb != (uv_fs_cb)0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x4fd,"req.result == sizeof(test_buf)");
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  uv_fs_close(0,local_1e0,mkstemp_req1.result & 0xffffffff);
  uv_fs_req_cleanup(local_1e0);
  uv_fs_close(0,local_1e0,mkstemp_req2.result & 0xffffffff);
  uv_fs_req_cleanup(local_1e0);
  iVar1 = uv_fs_open(0,local_1e0,mkstemp_req1.path,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x507,"fd >= 0");
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  memset(buf,0,0x20);
  uVar4 = (uv_buf_t)uv_buf_init(buf,0x20);
  iov = uVar4;
  iVar2 = uv_fs_read(0,local_1e0,iVar1,&iov,1,0xffffffffffffffff,0);
  if (iVar2 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x50d,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x50e,"req.result >= 0");
    abort();
  }
  iVar2 = strcmp(buf,test_buf);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x50f,"strcmp(buf, test_buf) == 0");
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  uv_fs_close(0,local_1e0,iVar1);
  uv_fs_req_cleanup(local_1e0);
  unlink(mkstemp_req1.path);
  unlink(mkstemp_req2.path);
  uv_fs_req_cleanup(&mkstemp_req1);
  uv_fs_req_cleanup(&mkstemp_req2);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x51a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_mkstemp) {
  int r;
  int fd;
  const char path_template[] = "test_file_XXXXXX";
  uv_fs_t req;

  loop = uv_default_loop();

  r = uv_fs_mkstemp(loop, &mkstemp_req1, path_template, mkstemp_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkstemp_cb_count == 1);

  /* sync mkstemp */
  r = uv_fs_mkstemp(NULL, &mkstemp_req2, path_template, NULL);
  ASSERT(r >= 0);
  check_mkstemp_result(&mkstemp_req2);

  /* mkstemp return different values on subsequent calls */
  ASSERT(strcmp(mkstemp_req1.path, mkstemp_req2.path) != 0);

  /* invalid template returns EINVAL */
  ASSERT(uv_fs_mkstemp(NULL, &mkstemp_req3, "test_file", NULL) == UV_EINVAL);

  /* We can write to the opened file */
  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, mkstemp_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Cleanup */
  uv_fs_close(NULL, &req, mkstemp_req1.result, NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_close(NULL, &req, mkstemp_req2.result, NULL);
  uv_fs_req_cleanup(&req);

  fd = uv_fs_open(NULL, &req, mkstemp_req1.path , O_RDONLY, 0, NULL);
  ASSERT(fd >= 0);
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, fd, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&req);

  uv_fs_close(NULL, &req, fd, NULL);
  uv_fs_req_cleanup(&req);

  unlink(mkstemp_req1.path);
  unlink(mkstemp_req2.path);
  uv_fs_req_cleanup(&mkstemp_req1);
  uv_fs_req_cleanup(&mkstemp_req2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}